

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O1

Box<Imath_3_2::Vec3<float>_> *
Imath_3_2::affineTransform<float,float>(Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m)

{
  int i;
  long lVar1;
  Box<Imath_3_2::Vec3<float>_> *newBox;
  Box<Imath_3_2::Vec3<float>_> *in_RDI;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar4 = (box->min).x;
  fVar5 = (box->max).x;
  if ((((fVar4 <= fVar5) &&
       (fVar6 = (box->min).y, pfVar2 = &(box->max).y, fVar6 < *pfVar2 || fVar6 == *pfVar2)) &&
      (fVar6 = (box->min).z, pfVar2 = &(box->max).z, fVar6 < *pfVar2 || fVar6 == *pfVar2)) &&
     ((((fVar5 != 3.4028235e+38 || (NAN(fVar5))) ||
       ((fVar4 != -3.4028235e+38 ||
        ((NAN(fVar4) || (fVar6 = (box->min).y, fVar6 != -3.4028235e+38)))))) ||
      ((NAN(fVar6) ||
       (((((fVar6 = (box->max).y, fVar6 != 3.4028235e+38 || (NAN(fVar6))) ||
          (fVar6 = (box->min).z, fVar6 != -3.4028235e+38)) ||
         ((NAN(fVar6) || (fVar6 = (box->max).z, fVar6 != 3.4028235e+38)))) || (NAN(fVar6))))))))) {
    (in_RDI->min).x = 3.4028235e+38;
    (in_RDI->min).y = 3.4028235e+38;
    *(undefined8 *)&(in_RDI->min).z = 0xff7fffff7f7fffff;
    (in_RDI->max).y = -3.4028235e+38;
    (in_RDI->max).z = -3.4028235e+38;
    lVar1 = 0;
    pfVar2 = (float *)m;
    do {
      fVar4 = m->x[3][lVar1];
      (&(in_RDI->max).x)[lVar1] = fVar4;
      (&(in_RDI->min).x)[lVar1] = fVar4;
      lVar3 = 0;
      fVar5 = fVar4;
      do {
        fVar7 = *(float *)((long)&(box->min).x + lVar3) * pfVar2[lVar3];
        fVar6 = pfVar2[lVar3] * *(float *)((long)&(box->max).x + lVar3);
        fVar8 = fVar7;
        if (fVar6 <= fVar7) {
          fVar8 = fVar6;
        }
        fVar4 = fVar4 + fVar8;
        if (fVar6 <= fVar7) {
          fVar6 = fVar7;
        }
        fVar5 = fVar5 + fVar6;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xc);
      (&(in_RDI->min).x)[lVar1] = fVar4;
      (&(in_RDI->max).x)[lVar1] = fVar5;
      lVar1 = lVar1 + 1;
      pfVar2 = pfVar2 + 1;
    } while (lVar1 != 3);
    return in_RDI;
  }
  (in_RDI->min).x = fVar4;
  fVar4 = (box->min).z;
  (in_RDI->min).y = (box->min).y;
  (in_RDI->min).z = fVar4;
  (in_RDI->max).x = fVar5;
  fVar4 = (box->max).z;
  (in_RDI->max).y = (box->max).y;
  (in_RDI->max).z = fVar4;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE Box<Vec3<S>>
affineTransform (const Box<Vec3<S>>& box, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    if (box.isEmpty () || box.isInfinite ()) return box;

    Box<Vec3<S>> newBox;

    for (int i = 0; i < 3; i++)
    {
        newBox.min[i] = newBox.max[i] = (S) m[3][i];

        for (int j = 0; j < 3; j++)
        {
            S a, b;

            a = (S) m[j][i] * box.min[j];
            b = (S) m[j][i] * box.max[j];

            if (a < b)
            {
                newBox.min[i] += a;
                newBox.max[i] += b;
            }
            else
            {
                newBox.min[i] += b;
                newBox.max[i] += a;
            }
        }
    }

    return newBox;
}